

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_scalar_t<bool,_cfgfile::string_trait_t>::on_string
          (tag_scalar_t<bool,_cfgfile::string_trait_t> *this,
          parser_info_t<cfgfile::string_trait_t> *info,string_t *str)

{
  bool bVar1;
  exception_t<cfgfile::string_trait_t> *peVar2;
  allocator<char> local_2ad;
  allocator<char> local_2ac;
  allocator<char> local_2ab;
  allocator<char> local_2aa;
  allocator<char> local_2a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  string local_248 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator<char> local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  allocator<char> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->super_tag_t<cfgfile::string_trait_t>).m_is_defined != false) {
    peVar2 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"Value for the tag \"",local_88);
    std::__cxx11::string::string((string *)&local_1a8,(string *)&local_1c8);
    std::operator+(&local_188,&local_1a8,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
    std::__cxx11::string::string<std::allocator<char>>
              (local_208,"\" already defined. In file \"",(allocator<char> *)&local_a8);
    std::__cxx11::string::string((string *)&local_1e8,local_208);
    std::operator+(&local_168,&local_188,&local_1e8);
    std::operator+(&local_148,&local_168,&info->m_file_name);
    std::__cxx11::string::string<std::allocator<char>>
              (local_248,"\" on line ",(allocator<char> *)&local_c8);
    std::__cxx11::string::string((string *)&local_228,local_248);
    std::operator+(&local_128,&local_148,&local_228);
    std::__cxx11::to_string(&local_268,info->m_line_number);
    std::operator+(&local_108,&local_128,&local_268);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,".",local_e8);
    std::__cxx11::string::string((string *)&local_288,(string *)&local_2a8);
    std::operator+(&local_68,&local_108,&local_288);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar2,&local_68);
    __cxa_throw(peVar2,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  bVar1 = tag_t<cfgfile::string_trait_t>::is_any_child_defined
                    (&this->super_tag_t<cfgfile::string_trait_t>);
  if (!bVar1) {
    bVar1 = format_t<bool,_cfgfile::string_trait_t>::from_string(info,str);
    this->m_value = bVar1;
    (this->super_tag_t<cfgfile::string_trait_t>).m_is_defined = true;
    return;
  }
  peVar2 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>(local_208,"Value \"",&local_2a9);
  std::__cxx11::string::string((string *)&local_1e8,local_208);
  std::operator+(&local_1c8,&local_1e8,str);
  std::__cxx11::string::string<std::allocator<char>>(local_248,"\" for tag \"",&local_2aa);
  std::__cxx11::string::string((string *)&local_228,local_248);
  std::operator+(&local_1a8,&local_1c8,&local_228);
  std::operator+(&local_188,&local_1a8,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"\" must be defined before any child tag. In file \"",&local_2ab);
  std::__cxx11::string::string((string *)&local_268,(string *)&local_288);
  std::operator+(&local_168,&local_188,&local_268);
  std::operator+(&local_148,&local_168,&info->m_file_name);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,"\" on line ",&local_2ac);
  std::__cxx11::string::string((string *)&local_2a8,(string *)local_88);
  std::operator+(&local_128,&local_148,&local_2a8);
  std::__cxx11::to_string(&local_a8,info->m_line_number);
  std::operator+(&local_108,&local_128,&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_e8,".",&local_2ad);
  std::__cxx11::string::string((string *)&local_c8,(string *)local_e8);
  std::operator+(&local_48,&local_108,&local_c8);
  exception_t<cfgfile::string_trait_t>::exception_t(peVar2,&local_48);
  __cxa_throw(peVar2,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		if( !this->is_defined_member_value() )
		{
			if( this->is_any_child_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Value \"" ) + str +
					Trait::from_ascii( "\" for tag \"" ) + this->name() +
					Trait::from_ascii( "\" must be defined before any child "
						"tag. In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );

			m_value = format_t< bool, Trait >::from_string( info, str );

			this->set_defined();
		}
		else
			throw exception_t< Trait >(
				Trait::from_ascii( "Value for the tag \"" ) +
				this->name() +
				Trait::from_ascii( "\" already defined. In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );
	}